

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O1

void __thiscall BamTools::Internal::BamToolsIndex::~BamToolsIndex(BamToolsIndex *this)

{
  pointer pBVar1;
  pointer pcVar2;
  
  (this->super_BamIndex)._vptr_BamIndex = (_func_int **)&PTR__BamToolsIndex_0016b868;
  CloseFile(this);
  RaiiWrapper::~RaiiWrapper(&this->m_resources);
  pBVar1 = (this->m_indexFileSummary).
           super__Vector_base<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pBVar1 != (pointer)0x0) {
    operator_delete(pBVar1);
  }
  (this->super_BamIndex)._vptr_BamIndex = (_func_int **)&PTR__BamIndex_0016b818;
  pcVar2 = (this->super_BamIndex).m_errorString._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->super_BamIndex).m_errorString.field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

BamToolsIndex::~BamToolsIndex(void) {
    CloseFile();
}